

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O2

shared_ptr<SchemeObject> evaluate_string_in_global_context(string *s)

{
  ParseResult *__return_storage_ptr__;
  ostream *poVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar2;
  string *in_RSI;
  shared_ptr<SchemeObject> sVar3;
  ParseResult parsed;
  undefined1 local_1f8 [72];
  istringstream is;
  string local_1a0 [368];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&is);
  std::__cxx11::stringbuf::str(local_1a0);
  parsed.result = END;
  parsed.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  parsed.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  parsed.error._M_dataplus._M_p = (pointer)&parsed.error.field_2;
  parsed.error._M_string_length = 0;
  parsed.error.field_2._M_local_buf[0] = '\0';
  (s->_M_dataplus)._M_p = (pointer)0x0;
  s->_M_string_length = 0;
  iVar2 = 1;
  __return_storage_ptr__ = (ParseResult *)(local_1f8 + 0x10);
  do {
    read_object(__return_storage_ptr__,(istream *)&is);
    ParseResult::operator=(&parsed,__return_storage_ptr__);
    ParseResult::~ParseResult(__return_storage_ptr__);
    if (parsed.result == END) {
      if ((s->_M_dataplus)._M_p != (pointer)0x0) {
        ParseResult::~ParseResult(&parsed);
        std::__cxx11::istringstream::~istringstream((istringstream *)&is);
        sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             extraout_RDX._M_pi;
        sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)s;
        return (shared_ptr<SchemeObject>)
               sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"FAILED\nNothing to execute");
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_001175fa:
      exit(1);
    }
    if (parsed.result == ERROR) {
      poVar1 = std::operator<<((ostream *)&std::cout,"FAILED\nCould not parse expression ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
      poVar1 = std::operator<<(poVar1," in ");
      poVar1 = std::operator<<(poVar1,in_RSI);
      poVar1 = std::operator<<(poVar1,": ");
      poVar1 = std::operator<<(poVar1,(string *)&parsed.error);
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_001175fa;
    }
    ASTNode::evaluate((ExecutionResult *)__return_storage_ptr__,
                      parsed.node.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      &global_context);
    ExecutionResult::force_value((ExecutionResult *)local_1f8);
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)s,
               (__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2> *)local_1f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
    ExecutionResult::~ExecutionResult((ExecutionResult *)__return_storage_ptr__);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

static std::shared_ptr<SchemeObject> evaluate_string_in_global_context(const std::string &s)
{
    std::istringstream is;
    is.str(s);
    ParseResult parsed;
    std::shared_ptr<SchemeObject> object{nullptr};
    int expression_index = 0;
    while(true)
    {
        ++expression_index;
        parsed = read_object(is);
        if(parsed.result == parse_result_t::END)
        {
            if(!object)
            {
                std::cout << "FAILED\nNothing to execute" << std::endl;
                exit(1);
            }
            break;
        }
        if(parsed.result == parse_result_t::ERROR)
        {
            std::cout << "FAILED\nCould not parse expression " << expression_index << " in " << s << ": "
                      << parsed.error << std::endl;
            exit(1);
        }
        try
        {
            object = parsed.node->evaluate(global_context).force_value();
        }
        catch(eval_error &e)
        {
            std::cout << "FAILED\nCould not evaluate expression " << expression_index << " in " << s << ": "
                      << e.what() << std::endl;
            exit(1);
        }
    }
    return object;
}